

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

void http2_data_done(Curl_cfilter *cf,Curl_easy *data,_Bool premature)

{
  int32_t stream_id;
  HTTP *pHVar1;
  undefined8 *puVar2;
  nghttp2_session *session;
  bool bVar3;
  _Bool _Var4;
  size_t size;
  long lVar5;
  int32_t *piVar6;
  
  if ((data == (Curl_easy *)0x0) || (pHVar1 = (data->req).p.http, pHVar1 == (HTTP *)0x0)) {
    piVar6 = (int32_t *)0x0;
  }
  else {
    piVar6 = (int32_t *)pHVar1->h2_ctx;
  }
  if (piVar6 == (int32_t *)0x0) {
    return;
  }
  puVar2 = (undefined8 *)cf->ctx;
  if ((nghttp2_session *)*puVar2 != (nghttp2_session *)0x0) {
    bVar3 = false;
    nghttp2_session_set_stream_user_data((nghttp2_session *)*puVar2,*piVar6,(void *)0x0);
    if (*(char *)((long)piVar6 + 0x14d) == '\0') {
      if (*piVar6 < 1) {
        bVar3 = false;
      }
      else {
        if ((((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
            ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) && (0 < cf->cft->log_level)) {
          Curl_trc_cf_infof(data,cf,"[%d] premature DATA_DONE, RST stream");
        }
        *(undefined2 *)((long)piVar6 + 0x14d) = 0x101;
        *(undefined1 *)((long)piVar6 + 0x151) = 1;
        nghttp2_submit_rst_stream((nghttp2_session *)*puVar2,'\0',*piVar6,5);
        bVar3 = true;
      }
    }
    _Var4 = Curl_bufq_is_empty((bufq *)(piVar6 + 2));
    if (_Var4) {
      if (!bVar3) goto LAB_00142723;
    }
    else {
      session = (nghttp2_session *)*puVar2;
      stream_id = *piVar6;
      size = Curl_bufq_len((bufq *)(piVar6 + 2));
      nghttp2_session_consume(session,stream_id,size);
    }
    nghttp2_session_send((nghttp2_session *)*puVar2);
  }
LAB_00142723:
  Curl_bufq_free((bufq *)(piVar6 + 0x12));
  Curl_bufq_free((bufq *)(piVar6 + 2));
  Curl_h1_req_parse_free((h1_req_parser *)(piVar6 + 0x22));
  Curl_dynhds_free((dynhds *)(piVar6 + 0x36));
  if (*(long *)(piVar6 + 0x4a) != 0) {
    lVar5 = *(long *)(piVar6 + 0x4c);
    while (lVar5 != 0) {
      (*Curl_cfree)(*(void **)(*(long *)(piVar6 + 0x4a) + -8 + lVar5 * 8));
      lVar5 = *(long *)(piVar6 + 0x4c) + -1;
      *(long *)(piVar6 + 0x4c) = lVar5;
    }
    (*Curl_cfree)(*(void **)(piVar6 + 0x4a));
    piVar6[0x4a] = 0;
    piVar6[0x4b] = 0;
  }
  (*Curl_cfree)(piVar6);
  ((data->req).p.http)->h2_ctx = (void *)0x0;
  return;
}

Assistant:

static void http2_data_done(struct Curl_cfilter *cf,
                            struct Curl_easy *data, bool premature)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  struct stream_ctx *stream = H2_STREAM_CTX(data);

  DEBUGASSERT(ctx);
  (void)premature;
  if(!stream)
    return;

  if(ctx->h2) {
    bool flush_egress = FALSE;
    /* returns error if stream not known, which is fine here */
    (void)nghttp2_session_set_stream_user_data(ctx->h2, stream->id, NULL);

    if(!stream->closed && stream->id > 0) {
      /* RST_STREAM */
      CURL_TRC_CF(data, cf, "[%d] premature DATA_DONE, RST stream",
                  stream->id);
      stream->closed = TRUE;
      stream->reset = TRUE;
      stream->send_closed = TRUE;
      nghttp2_submit_rst_stream(ctx->h2, NGHTTP2_FLAG_NONE,
                                stream->id, NGHTTP2_STREAM_CLOSED);
      flush_egress = TRUE;
    }
    if(!Curl_bufq_is_empty(&stream->recvbuf)) {
      /* Anything in the recvbuf is still being counted
       * in stream and connection window flow control. Need
       * to free that space or the connection window might get
       * exhausted eventually. */
      nghttp2_session_consume(ctx->h2, stream->id,
                              Curl_bufq_len(&stream->recvbuf));
      /* give WINDOW_UPATE a chance to be sent, but ignore any error */
      flush_egress = TRUE;
    }

    if(flush_egress)
      nghttp2_session_send(ctx->h2);
  }

  Curl_bufq_free(&stream->sendbuf);
  Curl_bufq_free(&stream->recvbuf);
  Curl_h1_req_parse_free(&stream->h1);
  Curl_dynhds_free(&stream->resp_trailers);
  if(stream->push_headers) {
    /* if they weren't used and then freed before */
    for(; stream->push_headers_used > 0; --stream->push_headers_used) {
      free(stream->push_headers[stream->push_headers_used - 1]);
    }
    free(stream->push_headers);
    stream->push_headers = NULL;
  }

  free(stream);
  H2_STREAM_LCTX(data) = NULL;
}